

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::semantic_rule<jsonip::grammar::array_start,jsonip::parser::char_<(char)91>>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  
  bVar1 = char_<(char)91>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state);
  if (bVar1) {
    semantic_state::array_start(state->ss_);
  }
  return bVar1;
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }